

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O1

void UCNV_FROM_U_CALLBACK_ESCAPE_63
               (void *context,UConverterFromUnicodeArgs *fromArgs,UChar *codeUnits,int32_t length,
               UChar32 codePoint,UConverterCallbackReason reason,UErrorCode *err)

{
  UChar *pUVar1;
  byte bVar2;
  int iVar3;
  int32_t iVar4;
  UErrorCode UVar5;
  uint uVar6;
  ulong uVar7;
  UConverterFromUCallback original;
  UConverterFromUCallback ignoredCallback;
  void *originalContext;
  UChar *myValueSource;
  UChar valueString [48];
  void *ignoredContext;
  UErrorCode local_bc;
  UConverterFromUCallback local_b8;
  UConverterFromUCallback local_b0;
  void *local_a8;
  UChar *local_a0;
  UChar local_98 [48];
  void *local_38;
  
  local_a0 = (UChar *)0x0;
  local_bc = U_ZERO_ERROR;
  local_b8 = (UConverterFromUCallback)0x0;
  local_b0 = (UConverterFromUCallback)0x0;
  if (2 < (int)reason) {
    return;
  }
  if (reason == UCNV_UNASSIGNED) {
    UVar5 = U_ZERO_ERROR;
    if (codePoint < 0x200b) {
      if (codePoint < 0x17b4) {
        if (codePoint < 0x115f) {
          if (((codePoint == 0xad) || (codePoint == 0x34f)) || (codePoint == 0x61c))
          goto LAB_002bdd5f;
          goto LAB_002bdb13;
        }
        uVar6 = codePoint - 0x115f;
      }
      else {
        if (codePoint - 0x180bU < 4) goto LAB_002bdd5f;
        uVar6 = codePoint - 0x17b4;
      }
      if (uVar6 < 2) goto LAB_002bdd5f;
    }
    else if ((codePoint - 0x200bU < 0x24) &&
            ((0xf8000001fU >> ((ulong)(codePoint - 0x200bU) & 0x3f) & 1) != 0)) goto LAB_002bdd5f;
LAB_002bdb13:
    if (((((codePoint == 0x3164 || (codePoint & 0xfffffff0U) == 0x2060) ||
          ((codePoint & 0xfffff000U) == 0xe0000)) ||
         ((codePoint - 0x1d173U < 8 ||
          (((codePoint & 0xfffffffcU) == 0x1bca0 || (codePoint - 0xfff0U < 9)))))) ||
        (codePoint == 0xffa0)) || ((codePoint == 0xfeff || ((codePoint & 0xfffffff0U) == 0xfe00))))
    goto LAB_002bdd5f;
  }
  ucnv_setFromUCallBack_63
            (fromArgs->converter,UCNV_FROM_U_CALLBACK_SUBSTITUTE_63,(void *)0x0,&local_b8,&local_a8,
             &local_bc);
  UVar5 = local_bc;
  if (U_ZERO_ERROR < local_bc) goto LAB_002bdd5f;
  if (context == (void *)0x0) {
    if (length < 1) {
LAB_002bdc5c:
      iVar3 = 0;
    }
    else {
      uVar7 = 0;
      iVar3 = 0;
      do {
        (local_98 + iVar3)[0] = L'%';
        (local_98 + iVar3)[1] = L'U';
        pUVar1 = codeUnits + uVar7;
        uVar7 = uVar7 + 1;
        iVar4 = uprv_itou_63(local_98 + (long)iVar3 + 2,0x2e - iVar3,(uint)(ushort)*pUVar1,0x10,4);
        iVar3 = iVar4 + iVar3 + 2;
      } while ((uint)length != uVar7);
    }
  }
  else {
    bVar2 = *context;
    if (bVar2 < 0x53) {
      if (bVar2 == 0x43) {
        if (length == 2) {
          local_98[0] = L'\\';
          local_98[1] = L'U';
          iVar4 = 8;
        }
        else {
          local_98[0] = L'\\';
          local_98[1] = L'u';
          codePoint = (UChar32)(ushort)*codeUnits;
          iVar4 = 4;
        }
        iVar4 = uprv_itou_63(local_98 + 2,0x2e,codePoint,0x10,iVar4);
        iVar3 = iVar4 + 2;
      }
      else if (bVar2 == 0x44) {
        local_98[0] = L'&';
        local_98[1] = L'#';
        if (length != 2) {
          codePoint = (UChar32)(ushort)*codeUnits;
        }
        iVar4 = uprv_itou_63(local_98 + 2,0x2e,codePoint,10,0);
        iVar3 = iVar4 + 3;
        local_98[(long)iVar4 + 2] = L';';
      }
      else if (bVar2 == 0x4a) {
        if (length < 1) goto LAB_002bdc5c;
        uVar7 = 0;
        iVar3 = 0;
        do {
          (local_98 + iVar3)[0] = L'\\';
          (local_98 + iVar3)[1] = L'u';
          pUVar1 = codeUnits + uVar7;
          uVar7 = uVar7 + 1;
          iVar4 = uprv_itou_63(local_98 + (long)iVar3 + 2,0x2e - iVar3,(uint)(ushort)*pUVar1,0x10,4)
          ;
          iVar3 = iVar4 + iVar3 + 2;
        } while ((uint)length != uVar7);
      }
      else {
LAB_002bdc0f:
        if (length < 1) goto LAB_002bdc5c;
        uVar7 = 0;
        iVar3 = 0;
        do {
          (local_98 + iVar3)[0] = L'%';
          (local_98 + iVar3)[1] = L'U';
          pUVar1 = codeUnits + uVar7;
          uVar7 = uVar7 + 1;
          iVar4 = uprv_itou_63(local_98 + (long)iVar3 + 2,0x2e - iVar3,(uint)(ushort)*pUVar1,0x10,4)
          ;
          iVar3 = iVar4 + iVar3 + 2;
        } while ((uint)length != uVar7);
      }
    }
    else if (bVar2 == 0x53) {
      local_98[0] = 0x5c;
      iVar4 = uprv_itou_63(local_98 + 1,0x2f,codePoint,0x10,0);
      iVar3 = iVar4 + 2;
      local_98[(long)iVar4 + 1] = L' ';
    }
    else if (bVar2 == 0x55) {
      local_98[0] = L'{';
      local_98[1] = L'U';
      local_98[2] = 0x2b;
      if (length != 2) {
        codePoint = (UChar32)(ushort)*codeUnits;
      }
      iVar4 = uprv_itou_63(local_98 + 3,0x2d,codePoint,0x10,4);
      iVar3 = iVar4 + 4;
      local_98[(long)iVar4 + 3] = L'}';
    }
    else {
      if (bVar2 != 0x58) goto LAB_002bdc0f;
      local_98[0] = L'&';
      local_98[1] = L'#';
      local_98[2] = 0x78;
      if (length != 2) {
        codePoint = (UChar32)(ushort)*codeUnits;
      }
      iVar4 = uprv_itou_63(local_98 + 3,0x2d,codePoint,0x10,0);
      iVar3 = iVar4 + 4;
      local_98[(long)iVar4 + 3] = L';';
    }
  }
  local_a0 = local_98;
  *err = U_ZERO_ERROR;
  ucnv_cbFromUWriteUChars_63(fromArgs,&local_a0,local_98 + iVar3,0,err);
  ucnv_setFromUCallBack_63(fromArgs->converter,local_b8,local_a8,&local_b0,&local_38,&local_bc);
  UVar5 = local_bc;
  if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
LAB_002bdd5f:
  *err = UVar5;
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
UCNV_FROM_U_CALLBACK_ESCAPE (
                         const void *context,
                         UConverterFromUnicodeArgs *fromArgs,
                         const UChar *codeUnits,
                         int32_t length,
                         UChar32 codePoint,
                         UConverterCallbackReason reason,
                         UErrorCode * err)
{

  UChar valueString[VALUE_STRING_LENGTH];
  int32_t valueStringLength = 0;
  int32_t i = 0;

  const UChar *myValueSource = NULL;
  UErrorCode err2 = U_ZERO_ERROR;
  UConverterFromUCallback original = NULL;
  const void *originalContext;

  UConverterFromUCallback ignoredCallback = NULL;
  const void *ignoredContext;
  
  if (reason > UCNV_IRREGULAR)
  {
      return;
  }
  else if (reason == UCNV_UNASSIGNED && IS_DEFAULT_IGNORABLE_CODE_POINT(codePoint))
  {
      /*
       * Skip if the codepoint has unicode property of default ignorable.
       */
      *err = U_ZERO_ERROR;
      return;
  }

  ucnv_setFromUCallBack (fromArgs->converter,
                     (UConverterFromUCallback) UCNV_FROM_U_CALLBACK_SUBSTITUTE,
                     NULL,
                     &original,
                     &originalContext,
                     &err2);
  
  if (U_FAILURE (err2))
  {
    *err = err2;
    return;
  } 
  if(context==NULL)
  { 
      while (i < length)
      {
        valueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT;  /* adding % */
        valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT; /* adding U */
        valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
      }
  }
  else
  {
      switch(*((char*)context))
      {
      case UCNV_PRV_ESCAPE_JAVA:
          while (i < length)
          {
              valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
              valueString[valueStringLength++] = (UChar) UNICODE_U_LOW_CODEPOINT; /* adding u */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
          }
          break;

      case UCNV_PRV_ESCAPE_C:
          valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */

          if(length==2){
              valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT; /* adding U */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 8);

          }
          else{
              valueString[valueStringLength++] = (UChar) UNICODE_U_LOW_CODEPOINT; /* adding u */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 4);
          }
          break;

      case UCNV_PRV_ESCAPE_XML_DEC:

          valueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
          valueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
          if(length==2){
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 10, 0);
          }
          else{
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 10, 0);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
          break;

      case UCNV_PRV_ESCAPE_XML_HEX:

          valueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
          valueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
          valueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
          if(length==2){
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 0);
          }
          else{
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 0);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
          break;

      case UCNV_PRV_ESCAPE_UNICODE:
          valueString[valueStringLength++] = (UChar) UNICODE_LEFT_CURLY_CODEPOINT;    /* adding { */
          valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT;    /* adding U */
          valueString[valueStringLength++] = (UChar) UNICODE_PLUS_CODEPOINT; /* adding + */
          if (length == 2) {
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 4);
          } else {
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[0], 16, 4);
          }
          valueString[valueStringLength++] = (UChar) UNICODE_RIGHT_CURLY_CODEPOINT;    /* adding } */
          break;

      case UCNV_PRV_ESCAPE_CSS2:
          valueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
          valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, codePoint, 16, 0);
          /* Always add space character, becase the next character might be whitespace,
             which would erroneously be considered the termination of the escape sequence. */
          valueString[valueStringLength++] = (UChar) UNICODE_SPACE_CODEPOINT;
          break;

      default:
          while (i < length)
          {
              valueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT;  /* adding % */
              valueString[valueStringLength++] = (UChar) UNICODE_U_CODEPOINT;             /* adding U */
              valueStringLength += uprv_itou (valueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint16_t)codeUnits[i++], 16, 4);
          }
      }
  }  
  myValueSource = valueString;

  /* reset the error */
  *err = U_ZERO_ERROR;

  ucnv_cbFromUWriteUChars(fromArgs, &myValueSource, myValueSource+valueStringLength, 0, err);

  ucnv_setFromUCallBack (fromArgs->converter,
                         original,
                         originalContext,
                         &ignoredCallback,
                         &ignoredContext,
                         &err2);
  if (U_FAILURE (err2))
  {
      *err = err2;
      return;
  }

  return;
}